

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikcp.c
# Opt level: O3

void ikcp_update(ikcpcb *kcp,IUINT32 current)

{
  IUINT32 IVar1;
  IUINT32 IVar2;
  
  kcp->current = current;
  if (kcp->updated == 0) {
    kcp->updated = 1;
    kcp->ts_flush = current;
    IVar1 = current;
  }
  else {
    IVar1 = kcp->ts_flush;
  }
  IVar2 = current;
  if ((0xffffffffffffb1df < (long)(int)(current - IVar1) - 10000U) &&
     (IVar2 = IVar1, (int)(current - IVar1) < 0)) {
    return;
  }
  IVar2 = IVar2 + kcp->interval;
  IVar1 = kcp->interval + current;
  if ((int)(current - IVar2) < 0) {
    IVar1 = IVar2;
  }
  kcp->ts_flush = IVar1;
  ikcp_flush(kcp);
  return;
}

Assistant:

void ikcp_update(ikcpcb *kcp, IUINT32 current)
{
	IINT32 slap;

	kcp->current = current;

	if (kcp->updated == 0) {
		kcp->updated = 1;
		kcp->ts_flush = kcp->current;
	}

	slap = _itimediff(kcp->current, kcp->ts_flush);

	if (slap >= 10000 || slap < -10000) {
		kcp->ts_flush = kcp->current;
		slap = 0;
	}

	if (slap >= 0) {
		kcp->ts_flush += kcp->interval;
		if (_itimediff(kcp->current, kcp->ts_flush) >= 0) {
			kcp->ts_flush = kcp->current + kcp->interval;
		}
		ikcp_flush(kcp);
	}
}